

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt.h
# Opt level: O2

void __thiscall crnlib::dxt5_block::flip_x(dxt5_block *this,uint w,uint h)

{
  uint val;
  uint val_00;
  uint y;
  uint y_00;
  uint x;
  uint x_00;
  
  for (x_00 = 0; x_00 != w >> 1; x_00 = x_00 + 1) {
    for (y_00 = 0; h != y_00; y_00 = y_00 + 1) {
      val = get_selector(this,x_00,y_00);
      val_00 = get_selector(this,~x_00 + w,y_00);
      set_selector(this,x_00,y_00,val_00);
      set_selector(this,~x_00 + w,y_00,val);
    }
  }
  return;
}

Assistant:

inline void flip_x(uint w = 4, uint h = 4)
        {
            for (uint x = 0; x < (w / 2); x++)
            {
                for (uint y = 0; y < h; y++)
                {
                    const uint c = get_selector(x, y);
                    set_selector(x, y, get_selector((w - 1) - x, y));
                    set_selector((w - 1) - x, y, c);
                }
            }
        }